

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall agge::tests::RendererTests::ScanlineIsOmittedIfCannotBegin(RendererTests *this)

{
  cell *pcVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  int iVar5;
  cell *pcVar6;
  cell *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  scanline_cells sVar12;
  mask<8UL> mask;
  cell cells3 [2];
  scanline_cells cells [3];
  scanline_mockup local_180;
  string local_158;
  LocationInfo local_138;
  mask<8UL> local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  cell local_a4;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  cell local_74;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_68;
  undefined8 *local_58;
  cell *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  
  local_180.excepted_y = -1000000;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_180._25_8_ = 0;
  local_180._current_y = 0x7fffffff;
  local_68.second = &local_74;
  local_98._0_8_ = 0;
  local_88 = 0;
  uStack_7c = 0;
  local_98._8_8_ = 0xb00000011;
  uStack_84 = 0xfffffffd;
  uStack_80 = 0xd;
  local_78 = 0xfffffff2;
  local_50 = &local_a4;
  local_b8 = 0;
  uStack_ac = 0;
  local_c8 = 0xffffffff;
  uStack_c0 = 0x7000000aa;
  uStack_b4 = 0xfffffffd;
  uStack_b0 = 0x11;
  local_a8 = 0xffffff59;
  local_40 = local_d0;
  local_d8 = 0xffffff8b00000000;
  local_e8 = 0;
  uStack_e0 = 0xd00000075;
  local_68.first = (cell *)local_98;
  local_58 = &local_c8;
  local_48 = &local_e8;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask<8ul> *)&local_110,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [3])
             &local_68,0x1f);
  local_180.excepted_y = 0x20;
  if (0 < local_110._height) {
    iVar8 = local_110._height + local_110._min_y;
    iVar10 = local_110._min_y;
    do {
      sVar12 = mocks::mask<8UL>::operator[](&local_110,iVar10);
      pcVar7 = sVar12.second;
      pcVar6 = sVar12.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar10);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar9 = 0;
LAB_0016e9bb:
          iVar11 = pcVar6->x;
          iVar5 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar5 = iVar5 + pcVar1->area;
            uVar9 = uVar9 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar11);
          if (iVar5 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar11,uVar9 * 0x200 - iVar5);
            iVar11 = iVar11 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar5 = pcVar6->x - iVar11;
            if ((uVar9 & 0x7fffff) != 0 && iVar5 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_180,iVar11,iVar5,uVar9 * 0x200);
            }
            goto LAB_0016e9bb;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_180);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar8);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_158,0x250);
  psVar3 = local_180.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pointer)CONCAT71(local_180.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             local_180.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a19b0,
             (span (*) [3])
             local_180.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)psVar2,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (psVar2 != psVar3) {
    local_180.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(psVar3,0);
    local_180.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)psVar3 >> 8);
  }
  local_180.excepted_y = 0x21;
  if (0 < local_110._height) {
    iVar10 = local_110._min_y;
    do {
      sVar12 = mocks::mask<8UL>::operator[](&local_110,iVar10);
      pcVar7 = sVar12.second;
      pcVar6 = sVar12.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar10);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar9 = 0;
LAB_0016eb24:
          iVar8 = pcVar6->x;
          iVar11 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar11 = iVar11 + pcVar1->area;
            uVar9 = uVar9 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar8);
          if (iVar11 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar8,uVar9 * 0x200 - iVar11);
            iVar8 = iVar8 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar11 = pcVar6->x - iVar8;
            if ((uVar9 & 0x7fffff) != 0 && iVar11 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_180,iVar8,iVar11,uVar9 * 0x200);
            }
            goto LAB_0016eb24;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_180);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < local_110._height + local_110._min_y);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_158,0x25f);
  psVar2 = local_180.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,4ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a19e0,
             (span (*) [4])
             local_180.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)CONCAT71(local_180.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         local_180.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_),&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_110._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}